

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLinearMipmapLinearSampleResultValid
               (ConstPixelBufferAccess *level0,ConstPixelBufferAccess *level1,Sampler *sampler,
               LookupPrecision *prec,float coordX,int coordY,Vec2 *fBounds,Vec4 *result)

{
  bool bVar1;
  int dim;
  int dim_00;
  int iVar2;
  int iVar3;
  deInt32 dVar4;
  deInt32 dVar5;
  TextureChannelClass TVar6;
  TextureFormat *pTVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float local_118;
  float local_114;
  Vector<float,_2> local_f0;
  Vector<float,_2> local_e8;
  float local_e0;
  float local_dc;
  float maxA1;
  float minA1;
  int x1_1;
  int x0_1;
  float searchStep1;
  ColorLine line1;
  int i1;
  float maxA0;
  float minA0;
  int x1;
  int x0;
  float searchStep0;
  ColorLine line0;
  int i0;
  float cSearchStep;
  TextureChannelClass texClass;
  int maxI1;
  int minI1;
  int maxI0;
  int minI0;
  Vec2 uBounds1;
  Vec2 uBounds0;
  int w1;
  int w0;
  Vec2 *fBounds_local;
  int coordY_local;
  float coordX_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  ConstPixelBufferAccess *level1_local;
  ConstPixelBufferAccess *level0_local;
  
  dim = ConstPixelBufferAccess::getWidth(level0);
  dim_00 = ConstPixelBufferAccess::getWidth(level1);
  bVar1 = sampler->normalizedCoords;
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds1,(bool)(bVar1 & 1),dim,coordX,iVar2,iVar3);
  bVar1 = sampler->normalizedCoords;
  iVar2 = Vector<int,_3>::x(&prec->coordBits);
  iVar3 = Vector<int,_3>::x(&prec->uvwBits);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&maxI0,(bool)(bVar1 & 1),dim_00,coordX,iVar2,iVar3);
  fVar8 = Vector<float,_2>::x(&uBounds1);
  fVar8 = (float)deFloorFloatToInt32(fVar8 - 0.5);
  fVar9 = Vector<float,_2>::y(&uBounds1);
  dVar4 = deFloorFloatToInt32(fVar9 - 0.5);
  fVar9 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
  fVar9 = (float)deFloorFloatToInt32(fVar9 - 0.5);
  fVar10 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
  dVar5 = deFloorFloatToInt32(fVar10 - 0.5);
  pTVar7 = ConstPixelBufferAccess::getFormat(level0);
  TVar6 = getTextureChannelClass(pTVar7->type);
  if (TVar6 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
    local_114 = computeBilinearSearchStepForUnorm(prec);
  }
  else {
    if (TVar6 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
      local_118 = computeBilinearSearchStepForSnorm(prec);
    }
    else {
      local_118 = 0.0;
    }
    local_114 = local_118;
  }
  line0.p1.m_data[3] = local_114;
  line0.p1.m_data[2] = fVar8;
  do {
    if (dVar4 < (int)line0.p1.m_data[2]) {
      return false;
    }
    ColorLine::ColorLine((ColorLine *)&x0);
    iVar2 = TexVerifierUtil::wrap(sampler->wrapS,(int)line0.p1.m_data[2],dim);
    iVar3 = TexVerifierUtil::wrap(sampler->wrapS,(int)line0.p1.m_data[2] + 1,dim);
    lookupLine((ColorLine *)&x0,level0,sampler,iVar2,iVar3,coordY);
    if (TVar6 == TEXTURECHANNELCLASS_FLOATING_POINT) {
      x1 = (int)computeBilinearSearchStepFromFloatLine(prec,(ColorLine *)&x0);
    }
    else {
      x1 = (int)line0.p1.m_data[3];
    }
    fVar8 = Vector<float,_2>::x(&uBounds1);
    fVar8 = de::clamp<float>((fVar8 - 0.5) - (float)(int)line0.p1.m_data[2],0.0,1.0);
    fVar10 = Vector<float,_2>::y(&uBounds1);
    line1.p1.m_data[3] = de::clamp<float>((fVar10 - 0.5) - (float)(int)line0.p1.m_data[2],0.0,1.0);
    for (line1.p1.m_data[2] = fVar9; (int)line1.p1.m_data[2] <= dVar5;
        line1.p1.m_data[2] = (float)((int)line1.p1.m_data[2] + 1)) {
      ColorLine::ColorLine((ColorLine *)&x0_1);
      minA1 = (float)TexVerifierUtil::wrap(sampler->wrapS,(int)line1.p1.m_data[2],dim_00);
      maxA1 = (float)TexVerifierUtil::wrap(sampler->wrapS,(int)line1.p1.m_data[2] + 1,dim_00);
      lookupLine((ColorLine *)&x0_1,level1,sampler,(int)minA1,(int)maxA1,coordY);
      if (TVar6 == TEXTURECHANNELCLASS_FLOATING_POINT) {
        x1_1 = (int)computeBilinearSearchStepFromFloatLine(prec,(ColorLine *)&x0_1);
      }
      else {
        x1_1 = (int)line0.p1.m_data[3];
      }
      fVar10 = Vector<float,_2>::x((Vector<float,_2> *)&maxI0);
      local_dc = de::clamp<float>((fVar10 - 0.5) - (float)(int)line1.p1.m_data[2],0.0,1.0);
      fVar10 = Vector<float,_2>::y((Vector<float,_2> *)&maxI0);
      local_e0 = de::clamp<float>((fVar10 - 0.5) - (float)(int)line1.p1.m_data[2],0.0,1.0);
      Vector<float,_2>::Vector(&local_e8,fVar8,line1.p1.m_data[3]);
      Vector<float,_2>::Vector(&local_f0,local_dc,local_e0);
      fVar10 = de::min<float>((float)x1,(float)x1_1);
      bVar1 = is1DTrilinearFilterResultValid
                        (prec,(ColorLine *)&x0,(ColorLine *)&x0_1,&local_e8,&local_f0,fBounds,fVar10
                         ,result);
      if (bVar1) {
        return true;
      }
    }
    line0.p1.m_data[2] = (float)((int)line0.p1.m_data[2] + 1);
  } while( true );
}

Assistant:

static bool isLinearMipmapLinearSampleResultValid (const ConstPixelBufferAccess&	level0,
												   const ConstPixelBufferAccess&	level1,
												   const Sampler&					sampler,
												   const LookupPrecision&			prec,
												   const float						coordX,
												   const int						coordY,
												   const Vec2&						fBounds,
												   const Vec4&						result)
{
	// \todo [2013-07-04 pyry] This is strictly not correct as coordinates between levels should be dependent.
	//						   Right now this allows pairing any two valid bilinear quads.

	const int					w0				= level0.getWidth();
	const int					w1				= level1.getWidth();

	const Vec2					uBounds0		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w0, coordX, prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					uBounds1		= computeNonNormalizedCoordBounds(sampler.normalizedCoords, w1, coordX, prec.coordBits.x(), prec.uvwBits.x());

	// Integer coordinates - without wrap mode
	const int					minI0			= deFloorFloatToInt32(uBounds0.x()-0.5f);
	const int					maxI0			= deFloorFloatToInt32(uBounds0.y()-0.5f);
	const int					minI1			= deFloorFloatToInt32(uBounds1.x()-0.5f);
	const int					maxI1			= deFloorFloatToInt32(uBounds1.y()-0.5f);

	const TextureChannelClass	texClass		= getTextureChannelClass(level0.getFormat().type);
	const float					cSearchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	for (int i0 = minI0; i0 <= maxI0; i0++)
	{
		ColorLine	line0;
		float		searchStep0;

		{
			const int	x0		= wrap(sampler.wrapS, i0  , w0);
			const int	x1		= wrap(sampler.wrapS, i0+1, w0);
			lookupLine(line0, level0, sampler, x0, x1, coordY);

			if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
				searchStep0 = computeBilinearSearchStepFromFloatLine(prec, line0);
			else
				searchStep0 = cSearchStep;
		}

		const float	minA0	= de::clamp((uBounds0.x()-0.5f)-float(i0), 0.0f, 1.0f);
		const float	maxA0	= de::clamp((uBounds0.y()-0.5f)-float(i0), 0.0f, 1.0f);

		for (int i1 = minI1; i1 <= maxI1; i1++)
		{
			ColorLine	line1;
			float		searchStep1;

			{
				const int	x0		= wrap(sampler.wrapS, i1  , w1);
				const int	x1		= wrap(sampler.wrapS, i1+1, w1);
				lookupLine(line1, level1, sampler, x0, x1, coordY);

				if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
					searchStep1 = computeBilinearSearchStepFromFloatLine(prec, line1);
				else
					searchStep1 = cSearchStep;
			}

			const float	minA1	= de::clamp((uBounds1.x()-0.5f)-float(i1), 0.0f, 1.0f);
			const float	maxA1	= de::clamp((uBounds1.y()-0.5f)-float(i1), 0.0f, 1.0f);

			if (is1DTrilinearFilterResultValid(prec, line0, line1, Vec2(minA0, maxA0), Vec2(minA1, maxA1), fBounds, de::min(searchStep0, searchStep1), result))
				return true;
		}
	}

	return false;
}